

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

int __thiscall pstore::romfs::romfs::stat(romfs *this,char *__file,stat *__buf)

{
  dirent *pdVar1;
  mode_t mVar2;
  undefined4 uVar3;
  error_code *peVar4;
  not_null<const_pstore::romfs::dirent_*> *pnVar5;
  stat *psVar6;
  error_code eVar7;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_30;
  
  parse_path(&local_30,(romfs *)__file,(not_null<const_char_*>)__buf,*(directory **)(__file + 8));
  if (local_30.has_error_ == false) {
    pnVar5 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_30);
    pdVar1 = pnVar5->ptr_;
    *(undefined1 *)&this[1].cwd_.ptr_ = 0;
    psVar6 = error_or<pstore::romfs::stat>::
             value_storage_impl<pstore::error_or<pstore::romfs::stat>&,pstore::romfs::stat>
                       ((error_or<pstore::romfs::stat> *)this);
    mVar2 = (pdVar1->stat_).mode;
    uVar3 = *(undefined4 *)&(pdVar1->stat_).field_0xc;
    psVar6->size = (pdVar1->stat_).size;
    psVar6->mode = mVar2;
    *(undefined4 *)&psVar6->field_0xc = uVar3;
    psVar6->mtime = (pdVar1->stat_).mtime;
  }
  else {
    eVar7 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_30);
    *(undefined1 *)&this[1].cwd_.ptr_ = 1;
    peVar4 = error_or<pstore::romfs::stat>::
             error_storage_impl<pstore::error_or<pstore::romfs::stat>&,std::error_code>
                       ((error_or<pstore::romfs::stat> *)this);
    peVar4->_M_value = eVar7._M_value;
    peVar4->_M_cat = eVar7._M_cat;
  }
  if (local_30.has_error_ == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
              (&local_30);
  }
  else {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
              (&local_30);
  }
  return (int)this;
}

Assistant:

error_or<struct stat> romfs::stat (not_null<czstring> const path) const {
            return this->parse_path (path) >>=
                   [] (dirent_ptr const de) { return error_or<struct stat>{de->stat ()}; };
        }